

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void set_slots_and_values(Am_Object *fake_start_object,Am_Value_List *slots_and_values_used)

{
  Am_Am_Slot_Key key;
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Am_Slot_Key local_72;
  Am_Assoc as;
  Am_Value_List just_slots;
  Am_Value target_v;
  Am_Value local_40;
  
  as.data = (Am_Assoc_Data *)0x0;
  target_v.type = 0;
  target_v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&just_slots);
  Am_Value_List::Start(slots_and_values_used);
  while( true ) {
    bVar1 = Am_Value_List::Last(slots_and_values_used);
    if (bVar1) break;
    in_value = Am_Value_List::Get(slots_and_values_used);
    Am_Assoc::operator=(&as,in_value);
    Am_Assoc::Value_1((Am_Assoc *)&local_40);
    Am_Am_Slot_Key::Am_Am_Slot_Key(&local_72,&local_40);
    key.value = local_72.value;
    Am_Value::~Am_Value(&local_40);
    Am_Assoc::Value_2((Am_Assoc *)&local_40);
    Am_Value::operator=(&target_v,&local_40);
    Am_Value::~Am_Value(&local_40);
    Am_Object::Set(fake_start_object,key.value,&target_v,1);
    Am_Value_List::Add(&just_slots,(uint)key.value,Am_TAIL,true);
    Am_Value_List::Next(slots_and_values_used);
  }
  value = Am_Value_List::operator_cast_to_Am_Wrapper_(&just_slots);
  Am_Object::Set(fake_start_object,0xb8,value,1);
  Am_Value_List::~Am_Value_List(&just_slots);
  Am_Value::~Am_Value(&target_v);
  Am_Assoc::~Am_Assoc(&as);
  return;
}

Assistant:

void
set_slots_and_values(Am_Object &fake_start_object,
                     Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Slot_Key key;
  Am_Value target_v;
  Am_Value_List just_slots;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = Am_Am_Slot_Key(as.Value_1());
    target_v = as.Value_2();
    fake_start_object.Set(key, target_v, Am_OK_IF_NOT_THERE);
    just_slots.Add((int)key);
  }
  fake_start_object.Set(Am_SLOTS_TO_SAVE, just_slots, Am_OK_IF_NOT_THERE);
}